

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O3

void __thiscall Cgmres<Model>::F_func(Cgmres<Model> *this,double *ret,double *U,double *x,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  double *pdVar8;
  double *lmd;
  bool bVar9;
  double dVar10;
  double xtau [204];
  double local_cf8 [208];
  double local_678 [192];
  undefined1 local_78 [32];
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (ret != U) {
    dVar10 = exp(t * -0.5);
    pdVar8 = local_cf8;
    local_cf8[0] = *x;
    local_cf8[1] = x[1];
    local_cf8[2] = x[2];
    local_cf8[3] = x[3];
    dVar10 = (1.0 - dVar10) / 50.0;
    lVar5 = 0;
    do {
      pdVar8 = pdVar8 + 4;
      dVar2 = local_cf8[lVar5 * 4 + 2];
      dVar3 = local_cf8[lVar5 * 4 + 3];
      local_cf8[lVar5 * 4 + 4] = dVar2;
      local_cf8[lVar5 * 4 + 5] = dVar3;
      dVar1 = local_cf8[lVar5 * 4];
      dVar4 = (U + lVar5 * 6)[1];
      local_cf8[lVar5 * 4 + 6] =
           U[lVar5 * 6] + ((local_cf8[lVar5 * 4 + 1] - dVar1) - (dVar2 + dVar2)) + dVar3;
      local_cf8[lVar5 * 4 + 7] = dVar4 + (((dVar1 - local_cf8[lVar5 * 4 + 1]) + dVar2) - dVar3);
      lVar6 = 0;
      do {
        dVar1 = (pdVar8 + lVar6)[1];
        pdVar8[lVar6] = pdVar8[lVar6] * dVar10;
        (pdVar8 + lVar6)[1] = dVar1 * dVar10;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 4);
      lVar6 = 0;
      do {
        dVar2 = (pdVar8 + lVar6)[1];
        dVar1 = (pdVar8 + lVar6 + -4)[1];
        pdVar8[lVar6] = pdVar8[lVar6] + pdVar8[lVar6 + -4];
        (pdVar8 + lVar6)[1] = dVar2 + dVar1;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x32);
    local_58 = (this->ptau[100] - local_cf8[200]) * -10.0;
    puVar7 = local_78;
    local_50 = (this->ptau[0x65] - local_cf8[0xc9]) * -10.0;
    local_48 = local_cf8[0xca];
    uStack_40 = local_cf8[0xcb];
    lVar5 = 0x31;
    do {
      Model::dHdx(local_678 + lVar5 * 4 + -4,local_cf8 + lVar5 * 4,U + lVar5 * 6,
                  this->ptau + lVar5 * 2,local_678 + lVar5 * 4);
      lVar6 = 0;
      do {
        dVar1 = *(double *)((long)(puVar7 + lVar6 * 8) + 8);
        *(double *)(puVar7 + lVar6 * 8) = *(double *)(puVar7 + lVar6 * 8) * dVar10;
        *(double *)((long)(puVar7 + lVar6 * 8) + 8) = dVar1 * dVar10;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 4);
      lVar6 = 0;
      do {
        dVar2 = *(double *)((long)(puVar7 + lVar6 * 8) + 8);
        dVar1 = *(double *)((long)(puVar7 + lVar6 * 8 + 0x20) + 8);
        *(double *)(puVar7 + lVar6 * 8) =
             *(double *)(puVar7 + lVar6 * 8) + *(double *)(puVar7 + lVar6 * 8 + 0x20);
        *(double *)((long)(puVar7 + lVar6 * 8) + 8) = dVar2 + dVar1;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 4);
      puVar7 = puVar7 + -0x20;
      bVar9 = lVar5 != 0;
      lVar5 = lVar5 + -1;
    } while (bVar9);
    pdVar8 = local_cf8;
    lmd = local_678;
    lVar5 = 0;
    do {
      Model::dHdu(ret,pdVar8,U,(double *)((long)this->ptau + lVar5),lmd);
      lVar5 = lVar5 + 0x10;
      lmd = lmd + 4;
      pdVar8 = pdVar8 + 4;
      ret = ret + 6;
      U = U + 6;
    } while (lVar5 != 800);
    return;
  }
  printf("%s pointer error ! (U_vec_tmp is overwritten due to the same address of ret)\n","F_func");
  exit(-1);
}

Assistant:

void F_func(double* ret, const double* U, const double* x, const double t) const {
    uint16_t idx_x, idx_u, idx_p;
    double dtau;
    double xtau[dim_x * (dv + 1)];
    double ltau[dim_x * (dv + 1)];

#ifdef DEBUG_MODE
    if (ret == U) {
      printf("%s pointer error ! (U_vec_tmp is overwritten due to the same address of ret)\n", __func__);
      exit(-1);
    }
#endif

    // Prediction horizon
    dtau = get_dtau(t);

    // State equation
    // x(0) = x
    // x(i + 1) = x(i) + dxdt(x(i), u(i), p(i)) * dtau
    mov(&xtau[0], x, dim_x);
    for (uint16_t i = 0; i < dv; i++) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dxdt(&xtau[idx_x + dim_x], &xtau[idx_x], &U[idx_u], &ptau[idx_p]);
      mul(&xtau[idx_x + dim_x], &xtau[idx_x + dim_x], dtau, dim_x);
      add(&xtau[idx_x + dim_x], &xtau[idx_x + dim_x], &xtau[idx_x], dim_x);
    }

    // Adjoint equation
    // lmd(N) = dPhidx(x(N), p(N))
    // lmd(i) = lmd(i + 1) + dHdx(x(i), u(i), p(i), lmd(i + 1)) * dtau
    Model::dPhidx(&ltau[dim_x * dv], &xtau[dim_x * dv], &ptau[dim_p * dv]);
    for (int16_t i = dv - 1; i >= 0; i--) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dHdx(&ltau[idx_x], &xtau[idx_x], &U[idx_u], &ptau[idx_p], &ltau[idx_x + dim_x]);
      mul(&ltau[idx_x], &ltau[idx_x], dtau, dim_x);
      add(&ltau[idx_x], &ltau[idx_x], &ltau[idx_x + dim_x], dim_x);
    }

    // F(i) = dHdU(x(i), u(i), lmd(i + 1))
    for (uint16_t i = 0; i < dv; i++) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dHdu(&ret[idx_u], &xtau[idx_x], &U[idx_u], &ptau[idx_p], &ltau[idx_x + dim_x]);
    }
  }